

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tableview.cpp
# Opt level: O3

int __thiscall
QtMWidgets::TableViewSection::qt_metacall(TableViewSection *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QWidget::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (((-1 < _id_00) && (_c < (BindableProperty|ReadProperty))) &&
     ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    _id_00 = _id_00 + -1;
  }
  return _id_00;
}

Assistant:

int QtMWidgets::TableViewSection::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    
#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}